

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t *ms,BYTE *ip)

{
  long *p;
  uint h;
  U32 *pUVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  pUVar1 = ms->hashTable;
  h = (ms->cParams).hashLog;
  pUVar2 = ms->chainTable;
  uVar4 = (ms->cParams).chainLog;
  pBVar3 = (ms->window).base;
  uVar9 = (long)ip - (long)pBVar3;
  bVar6 = 0x40 - (char)h;
  bVar7 = 0x20 - (char)h;
  iVar8 = (ms->cParams).minMatch - 5;
  for (uVar10 = (ulong)ms->nextToUpdate; uVar10 < (uVar9 & 0xffffffff); uVar10 = uVar10 + 1) {
    if (0x20 < h) goto LAB_0019a13a;
    p = (long *)(pBVar3 + uVar10);
    switch(iVar8) {
    case 0:
      uVar5 = *p * -0x30e4432345000000;
      goto LAB_0019a040;
    case 1:
      uVar5 = ZSTD_hash6Ptr(p,h);
      break;
    case 2:
      uVar5 = *p * -0x30e44323405a9d00;
LAB_0019a040:
      uVar5 = uVar5 >> (bVar6 & 0x3f);
      break;
    case 3:
      uVar5 = ZSTD_hash8Ptr(p,h);
      break;
    default:
      uVar5 = (ulong)((uint)((int)*p * -0x61c8864f) >> (bVar7 & 0x1f));
    }
    pUVar2[(uint)uVar10 & ~(-1 << ((byte)uVar4 & 0x1f))] = pUVar1[uVar5];
    pUVar1[uVar5] = (uint)uVar10;
  }
  ms->nextToUpdate = (U32)uVar9;
  if (h < 0x21) {
    switch(iVar8) {
    case 0:
      uVar9 = (ulong)(*(long *)ip * -0x30e4432345000000) >> (bVar6 & 0x3f);
      break;
    case 1:
      uVar9 = ZSTD_hash6Ptr(ip,h);
      break;
    case 2:
      uVar9 = (ulong)(*(long *)ip * -0x30e44323405a9d00) >> (bVar6 & 0x3f);
      break;
    case 3:
      uVar9 = ZSTD_hash8Ptr(ip,h);
      break;
    default:
      uVar9 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (bVar7 & 0x1f));
    }
    return pUVar1[uVar9];
  }
LAB_0019a13a:
  __assert_fail("hBits <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
}

Assistant:

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t* ms, const BYTE* ip) {
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    return ZSTD_insertAndFindFirstIndex_internal(ms, cParams, ip, ms->cParams.minMatch, /* lazySkipping*/ 0);
}